

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O3

void __thiscall
soul::heart::Printer::PrinterStream::printAssignmentSyntax(PrinterStream *this,Expression *e)

{
  CodePrinter *this_00;
  long lVar1;
  size_t sVar2;
  char *__s;
  string_view text;
  string_view text_00;
  
  this_00 = this->out;
  lVar1 = __dynamic_cast(e,&Expression::typeinfo,&Variable::typeinfo,0);
  if ((lVar1 == 0) || (*(int *)(lVar1 + 0x38) != 2)) {
    __s = "";
  }
  else {
    __s = "let ";
  }
  sVar2 = strlen(__s);
  text._M_str = __s;
  text._M_len = sVar2;
  choc::text::CodePrinter::writeBlock(this_00,text);
  printExpression(this,e);
  text_00._M_str = " = ";
  text_00._M_len = 3;
  choc::text::CodePrinter::writeBlock(this->out,text_00);
  return;
}

Assistant:

void printAssignmentSyntax (heart::Expression& e)
        {
            out << getAssignmentRole (e);
            printExpression (e);
            out << " = ";
        }